

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

int httplib::detail::select_read(socket_t sock,time_t sec,time_t usec)

{
  uint __i;
  int iVar1;
  long lVar2;
  timeval tv;
  fd_set fds;
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    fds.fds_bits[lVar2] = 0;
  }
  fds.fds_bits[sock / 0x40] = fds.fds_bits[sock / 0x40] | 1L << ((byte)sock & 0x3f);
  tv.tv_sec = sec;
  tv.tv_usec = usec;
  iVar1 = select(sock + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
  return iVar1;
}

Assistant:

inline int select_read(socket_t sock, time_t sec, time_t usec) {
#ifdef CPPHTTPLIB_USE_POLL
  struct pollfd pfd_read;
  pfd_read.fd = sock;
  pfd_read.events = POLLIN;

  auto timeout = static_cast<int>(sec * 1000 + usec / 1000);

  return poll(&pfd_read, 1, timeout);
#else
  fd_set fds;
  FD_ZERO(&fds);
  FD_SET(sock, &fds);

  timeval tv;
  tv.tv_sec = static_cast<long>(sec);
  tv.tv_usec = static_cast<long>(usec);

  return select(static_cast<int>(sock + 1), &fds, nullptr, nullptr, &tv);
#endif
}